

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

U32 ZSTD_fracWeight(U32 rawStat)

{
  uint uVar1;
  
  uVar1 = ZSTD_highbit32(rawStat + 1);
  if (uVar1 < 0x17) {
    return ((rawStat + 1) * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
  }
  __assert_fail("hb + BITCOST_ACCURACY < 31",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                ,0x3c,"U32 ZSTD_fracWeight(U32)");
}

Assistant:

MEM_STATIC U32 ZSTD_fracWeight(U32 rawStat)
{
    U32 const stat = rawStat + 1;
    U32 const hb = ZSTD_highbit32(stat);
    U32 const BWeight = hb * BITCOST_MULTIPLIER;
    /* Fweight was meant for "Fractional weight"
     * but it's effectively a value between 1 and 2
     * using fixed point arithmetic */
    U32 const FWeight = (stat << BITCOST_ACCURACY) >> hb;
    U32 const weight = BWeight + FWeight;
    assert(hb + BITCOST_ACCURACY < 31);
    return weight;
}